

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::compute_split_pca
          (clusterizer<crnlib::vec<2U,_float>_> *this,vec<2U,_float> *left_child_res,
          vec<2U,_float> *right_child_res,vq_node *parent_node)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar5;
  row_vec *prVar6;
  float *pfVar7;
  long in_RCX;
  vec<2U,_float> *in_RDX;
  vec<2U,_float> *in_RSI;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *in_RDI;
  float fVar8;
  float fVar9;
  float fVar10;
  double t;
  vec<2U,_float> *v_1;
  float weight;
  uint i_3;
  double right_weight;
  double left_weight;
  vec<2U,_float> right_child;
  vec<2U,_float> left_child;
  vec<2U,_float> delta_axis;
  uint j;
  double sum;
  uint i_2;
  double max_sum;
  vec<2U,_float> x_3;
  uint iter;
  vec<2U,_float> prev_axis;
  uint i_1;
  vec<2U,_float> axis;
  uint y_2;
  uint x_2;
  uint y_1;
  uint x_1;
  float one_over_total_weight;
  uint y;
  uint x;
  vec<2U,_float> w;
  vec<2U,_float> v;
  uint i;
  matrix<2U,_2U,_float> covar;
  uint N;
  float in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  float in_stack_fffffffffffffeb4;
  float in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffebc;
  float in_stack_fffffffffffffec0;
  float in_stack_fffffffffffffec4;
  float in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  float local_12c;
  vec<2U,_float> local_110;
  vec<2U,_float> local_108;
  vec<2U,_float> local_100;
  vec<2U,_float> local_f8;
  vec<2U,_float> local_f0;
  double local_e8;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *local_e0;
  float in_stack_ffffffffffffff28;
  vec<2U,_float> *right_child_res_00;
  vec<2U,_float> *left_child_res_00;
  clusterizer<crnlib::vec<2U,_float>_> *in_stack_ffffffffffffff40;
  vec<2U,_float> local_b4;
  vec<2U,_float> local_ac;
  uint local_a4;
  double local_a0;
  uint local_94;
  double local_90;
  vec<2U,_float> local_84;
  uint local_7c;
  vec<2U,_float> local_78;
  uint local_70;
  vec<2U,_float> local_6c;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  float local_54;
  uint local_50;
  uint local_4c;
  vec<2U,_float> local_48;
  vec<2U,_float> local_40;
  uint local_38;
  matrix<2U,_2U,_float> local_34;
  undefined4 local_24;
  long local_20;
  vec<2U,_float> *local_18;
  vec<2U,_float> *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)(in_RCX + 0x18));
  if (uVar2 == 2) {
    puVar4 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(local_20 + 0x18),0);
    ppVar5 = vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::operator[](in_RDI,*puVar4);
    vec<2U,_float>::operator=(local_10,&ppVar5->first);
    puVar4 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(local_20 + 0x18),1);
    ppVar5 = vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::operator[](in_RDI,*puVar4);
    vec<2U,_float>::operator=(local_18,&ppVar5->first);
  }
  else {
    local_24 = 2;
    matrix<2U,_2U,_float>::matrix
              ((matrix<2U,_2U,_float> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    matrix<2U,_2U,_float>::clear
              ((matrix<2U,_2U,_float> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    for (local_38 = 0; uVar1 = local_38,
        uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)(local_20 + 0x18)), uVar1 < uVar2
        ; local_38 = local_38 + 1) {
      puVar4 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(local_20 + 0x18),local_38);
      vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::operator[](in_RDI,*puVar4);
      crnlib::operator-((vec<2U,_float> *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                        (vec<2U,_float> *)
                        CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      puVar4 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(local_20 + 0x18),local_38);
      vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::operator[](in_RDI,*puVar4);
      crnlib::operator*((vec<2U,_float> *)
                        CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                        in_stack_fffffffffffffeb4);
      for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
        for (local_50 = local_4c; local_50 < 2; local_50 = local_50 + 1) {
          prVar6 = matrix<2U,_2U,_float>::operator[](&local_34,local_4c);
          pfVar7 = vec<2U,_float>::operator[](prVar6,local_50);
          fVar10 = *pfVar7;
          fVar8 = vec<2U,_float>::operator[](&local_40,local_4c);
          fVar9 = vec<2U,_float>::operator[](&local_48,local_50);
          prVar6 = matrix<2U,_2U,_float>::operator[](&local_34,local_4c);
          pfVar7 = vec<2U,_float>::operator[](prVar6,local_50);
          *pfVar7 = fVar10 + fVar8 * fVar9;
        }
      }
    }
    local_12c = (float)*(ulong *)(local_20 + 8);
    local_54 = 1.0 / local_12c;
    for (local_58 = 0; local_58 < 2; local_58 = local_58 + 1) {
      for (local_5c = local_58; local_5c < 2; local_5c = local_5c + 1) {
        in_stack_fffffffffffffecc = local_54;
        prVar6 = matrix<2U,_2U,_float>::operator[](&local_34,local_58);
        pfVar7 = vec<2U,_float>::operator[](prVar6,local_5c);
        *pfVar7 = in_stack_fffffffffffffecc * *pfVar7;
      }
    }
    for (local_60 = 0; local_60 == 0; local_60 = local_60 + 1) {
      local_64 = 0;
      while (local_64 = local_64 + 1, local_64 < 2) {
        prVar6 = matrix<2U,_2U,_float>::operator[](&local_34,local_60);
        pfVar7 = vec<2U,_float>::operator[](prVar6,local_64);
        in_stack_fffffffffffffec8 = *pfVar7;
        prVar6 = matrix<2U,_2U,_float>::operator[](&local_34,local_64);
        pfVar7 = vec<2U,_float>::operator[](prVar6,local_60);
        *pfVar7 = in_stack_fffffffffffffec8;
      }
    }
    vec<2U,_float>::vec(&local_6c);
    for (local_70 = 0; local_70 < 2; local_70 = local_70 + 1) {
      in_stack_fffffffffffffec0 = (float)local_70;
      iVar3 = math::maximum<int>(1,1);
      in_stack_fffffffffffffec4 =
           math::lerp<float,float>(0.75,1.25,in_stack_fffffffffffffec0 * (1.0 / (float)iVar3));
      pfVar7 = vec<2U,_float>::operator[](&local_6c,local_70);
      *pfVar7 = in_stack_fffffffffffffec4;
    }
    vec<2U,_float>::vec(&local_78,&local_6c);
    for (local_7c = 0; local_7c < 10; local_7c = local_7c + 1) {
      vec<2U,_float>::vec(&local_84);
      local_90 = 0.0;
      for (local_94 = 0; local_94 < 2; local_94 = local_94 + 1) {
        local_a0 = 0.0;
        for (local_a4 = 0; local_a4 < 2; local_a4 = local_a4 + 1) {
          pfVar7 = vec<2U,_float>::operator[](&local_6c,local_a4);
          in_stack_fffffffffffffebc = *pfVar7;
          prVar6 = matrix<2U,_2U,_float>::operator[](&local_34,local_94);
          pfVar7 = vec<2U,_float>::operator[](prVar6,local_a4);
          local_a0 = (double)(in_stack_fffffffffffffebc * *pfVar7) + local_a0;
        }
        in_stack_fffffffffffffeb8 = (float)local_a0;
        pfVar7 = vec<2U,_float>::operator[](&local_84,local_94);
        *pfVar7 = in_stack_fffffffffffffeb8;
        local_90 = math::maximum<double>(local_90,(double)((ulong)local_a0 & (ulong)DAT_00248210));
      }
      if ((local_90 != 0.0) || (NAN(local_90))) {
        vec<2U,_float>::operator*=(&local_84,(float)(1.0 / local_90));
      }
      crnlib::operator-((vec<2U,_float> *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                        (vec<2U,_float> *)
                        CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      vec<2U,_float>::operator=(&local_78,&local_6c);
      vec<2U,_float>::operator=(&local_6c,&local_84);
      fVar10 = vec<2U,_float>::norm(&local_ac);
      if (fVar10 < 0.0025) break;
    }
    vec<2U,_float>::normalize
              ((vec<2U,_float> *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (vec<2U,_float> *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    vec<2U,_float>::vec((vec<2U,_float> *)
                        CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                        in_stack_fffffffffffffeac);
    vec<2U,_float>::vec((vec<2U,_float> *)
                        CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                        in_stack_fffffffffffffeac);
    left_child_res_00 = (vec<2U,_float> *)0x0;
    right_child_res_00 = (vec<2U,_float> *)0x0;
    fVar10 = 0.0;
    while (fVar8 = fVar10,
          fVar9 = (float)vector<unsigned_int>::size((vector<unsigned_int> *)(local_20 + 0x18)),
          (uint)fVar10 < (uint)fVar9) {
      puVar4 = vector<unsigned_int>::operator[]
                         ((vector<unsigned_int> *)(local_20 + 0x18),(uint)fVar8);
      ppVar5 = vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::operator[](in_RDI,*puVar4);
      in_stack_ffffffffffffff28 = (float)ppVar5->second;
      puVar4 = vector<unsigned_int>::operator[]
                         ((vector<unsigned_int> *)(local_20 + 0x18),(uint)fVar8);
      local_e0 = vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::operator[]
                           (in_RDI,*puVar4);
      crnlib::operator-((vec<2U,_float> *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                        (vec<2U,_float> *)
                        CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      fVar9 = crnlib::operator*(&local_f0,&local_6c);
      local_e8 = (double)fVar9;
      if (0.0 <= local_e8) {
        crnlib::operator*((vec<2U,_float> *)
                          CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),fVar10);
        vec<2U,_float>::operator+=((vec<2U,_float> *)&stack0xffffffffffffff44,&local_100);
        right_child_res_00 =
             (vec<2U,_float> *)((double)in_stack_ffffffffffffff28 + (double)right_child_res_00);
      }
      else {
        crnlib::operator*((vec<2U,_float> *)
                          CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),fVar10);
        vec<2U,_float>::operator+=(&local_b4,&local_f8);
        left_child_res_00 =
             (vec<2U,_float> *)((double)in_stack_ffffffffffffff28 + (double)left_child_res_00);
      }
      fVar10 = (float)((int)fVar8 + 1);
    }
    if (((double)left_child_res_00 <= 0.0) || ((double)right_child_res_00 <= 0.0)) {
      compute_split_estimate
                (in_stack_ffffffffffffff40,left_child_res_00,right_child_res_00,
                 (vq_node *)CONCAT44(fVar8,in_stack_ffffffffffffff28));
    }
    else {
      crnlib::operator*((vec<2U,_float> *)
                        CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),fVar10);
      vec<2U,_float>::operator=(local_10,&local_108);
      crnlib::operator*((vec<2U,_float> *)
                        CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),fVar10);
      vec<2U,_float>::operator=(local_18,&local_110);
    }
  }
  return;
}

Assistant:

void compute_split_pca(VectorType& left_child_res, VectorType& right_child_res, const vq_node& parent_node) {
    if (parent_node.m_vectors.size() == 2) {
      left_child_res = m_training_vecs[parent_node.m_vectors[0]].first;
      right_child_res = m_training_vecs[parent_node.m_vectors[1]].first;
      return;
    }

    const uint N = VectorType::num_elements;

    matrix<N, N, float> covar;
    covar.clear();

    for (uint i = 0; i < parent_node.m_vectors.size(); i++) {
      const VectorType v(m_training_vecs[parent_node.m_vectors[i]].first - parent_node.m_centroid);
      const VectorType w(v * (float)m_training_vecs[parent_node.m_vectors[i]].second);

      for (uint x = 0; x < N; x++)
        for (uint y = x; y < N; y++)
          covar[x][y] = covar[x][y] + v[x] * w[y];
    }

    float one_over_total_weight = 1.0f / parent_node.m_total_weight;

    for (uint x = 0; x < N; x++)
      for (uint y = x; y < N; y++)
        covar[x][y] *= one_over_total_weight;

    for (uint x = 0; x < (N - 1); x++)
      for (uint y = x + 1; y < N; y++)
        covar[y][x] = covar[x][y];

    VectorType axis;  //(1.0f);
    if (N == 1)
      axis.set(1.0f);
    else {
      for (uint i = 0; i < N; i++)
        axis[i] = math::lerp(.75f, 1.25f, i * (1.0f / math::maximum<int>(N - 1, 1)));
    }

    VectorType prev_axis(axis);

    for (uint iter = 0; iter < 10; iter++) {
      VectorType x;

      double max_sum = 0;

      for (uint i = 0; i < N; i++) {
        double sum = 0;

        for (uint j = 0; j < N; j++)
          sum += axis[j] * covar[i][j];

        x[i] = static_cast<float>(sum);

        max_sum = math::maximum(max_sum, fabs(sum));
      }

      if (max_sum != 0.0f)
        x *= static_cast<float>(1.0f / max_sum);

      VectorType delta_axis(prev_axis - x);

      prev_axis = axis;
      axis = x;

      if (delta_axis.norm() < .0025f)
        break;
    }

    axis.normalize();

    VectorType left_child(0.0f);
    VectorType right_child(0.0f);

    double left_weight = 0.0f;
    double right_weight = 0.0f;

    for (uint i = 0; i < parent_node.m_vectors.size(); i++) {
      const float weight = (float)m_training_vecs[parent_node.m_vectors[i]].second;

      const VectorType& v = m_training_vecs[parent_node.m_vectors[i]].first;

      double t = (v - parent_node.m_centroid) * axis;
      if (t < 0.0f) {
        left_child += v * weight;
        left_weight += weight;
      } else {
        right_child += v * weight;
        right_weight += weight;
      }
    }

    if ((left_weight > 0.0f) && (right_weight > 0.0f)) {
      left_child_res = left_child * (float)(1.0f / left_weight);
      right_child_res = right_child * (float)(1.0f / right_weight);
    } else {
      compute_split_estimate(left_child_res, right_child_res, parent_node);
    }
  }